

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

TimeSamples *
tinyusdz::tydra::anon_unknown_6::
EnumTimeSamplesToTypelessTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>
          (TimeSamples *__return_storage_ptr__,
          TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation> *ts)

{
  double t;
  undefined8 uVar1;
  vector<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::Sample>_>
  *this;
  size_type sVar2;
  const_reference pvVar3;
  FaceVaryingLinearInterpolation v;
  Value local_88;
  string local_70;
  undefined1 local_50 [8];
  token tok;
  size_t i;
  vector<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::Sample>_>
  *samples;
  TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation> *ts_local;
  TimeSamples *dst;
  
  this = TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::get_samples(ts);
  tinyusdz::value::TimeSamples::TimeSamples(__return_storage_ptr__);
  for (tok.str_.field_2._8_8_ = 0; uVar1 = tok.str_.field_2._8_8_,
      sVar2 = ::std::
              vector<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::Sample>_>
              ::size(this), (ulong)uVar1 < sVar2;
      tok.str_.field_2._8_8_ = tok.str_.field_2._8_8_ + 1) {
    pvVar3 = ::std::
             vector<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::Sample>_>
             ::operator[](this,tok.str_.field_2._8_8_);
    tinyusdz::to_string_abi_cxx11_(&local_70,(tinyusdz *)(ulong)pvVar3->value,v);
    Token::Token((Token *)local_50,&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
    pvVar3 = ::std::
             vector<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::Sample>_>
             ::operator[](this,tok.str_.field_2._8_8_);
    t = pvVar3->t;
    tinyusdz::value::Value::Value<tinyusdz::Token>(&local_88,(Token *)local_50);
    tinyusdz::value::TimeSamples::add_sample(__return_storage_ptr__,t,&local_88);
    tinyusdz::value::Value::~Value(&local_88);
    Token::~Token((Token *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

value::TimeSamples EnumTimeSamplesToTypelessTimeSamples(
    const TypedTimeSamples<T> &ts) {
  const std::vector<typename TypedTimeSamples<T>::Sample> &samples =
      ts.get_samples();

  value::TimeSamples dst;

  for (size_t i = 0; i < samples.size(); i++) {
    // to token
    value::token tok(to_string(samples[i].value));
    dst.add_sample(samples[i].t, tok);
  }

  return dst;
}